

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionTime>::emplace<QTzTransitionTime_const&>
          (QPodArrayOps<QTzTransitionTime> *this,qsizetype i,QTzTransitionTime *args)

{
  QTzTransitionTime **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qint64 qVar4;
  quint8 qVar5;
  undefined7 uVar6;
  qsizetype qVar7;
  QTzTransitionTime *pQVar8;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QTzTransitionTime>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QTzTransitionTime>).size == i) &&
       (qVar7 = QArrayDataPointer<QTzTransitionTime>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QTzTransitionTime>), qVar7 != 0)) {
      qVar5 = args->ruleIndex;
      uVar6 = *(undefined7 *)&args->field_0x9;
      pQVar8 = (this->super_QArrayDataPointer<QTzTransitionTime>).ptr +
               (this->super_QArrayDataPointer<QTzTransitionTime>).size;
      pQVar8->atMSecsSinceEpoch = args->atMSecsSinceEpoch;
      pQVar8->ruleIndex = qVar5;
      *(undefined7 *)&pQVar8->field_0x9 = uVar6;
    }
    else {
      if ((i != 0) ||
         (qVar7 = QArrayDataPointer<QTzTransitionTime>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<QTzTransitionTime>), qVar7 == 0))
      goto LAB_003b88c2;
      pQVar8 = (this->super_QArrayDataPointer<QTzTransitionTime>).ptr;
      qVar5 = args->ruleIndex;
      uVar6 = *(undefined7 *)&args->field_0x9;
      pQVar8[-1].atMSecsSinceEpoch = args->atMSecsSinceEpoch;
      pQVar8[-1].ruleIndex = qVar5;
      *(undefined7 *)&pQVar8[-1].field_0x9 = uVar6;
      ppQVar1 = &(this->super_QArrayDataPointer<QTzTransitionTime>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTzTransitionTime>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_003b88c2:
  qVar4 = args->atMSecsSinceEpoch;
  qVar5 = args->ruleIndex;
  uVar6 = *(undefined7 *)&args->field_0x9;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTzTransitionTime>).size != 0);
  QArrayDataPointer<QTzTransitionTime>::detachAndGrow
            (&this->super_QArrayDataPointer<QTzTransitionTime>,where,1,(QTzTransitionTime **)0x0,
             (QArrayDataPointer<QTzTransitionTime> *)0x0);
  pQVar8 = createHole(this,where,i,1);
  pQVar8->atMSecsSinceEpoch = qVar4;
  pQVar8->ruleIndex = qVar5;
  *(undefined7 *)&pQVar8->field_0x9 = uVar6;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }